

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O1

void __thiscall
QExplicitlySharedDataPointer<QStaticTextPrivate>::detach_helper
          (QExplicitlySharedDataPointer<QStaticTextPrivate> *this)

{
  QStaticTextPrivate *pQVar1;
  QStaticTextPrivate *this_00;
  
  this_00 = (QStaticTextPrivate *)operator_new(0xe8);
  QStaticTextPrivate::QStaticTextPrivate(this_00,(this->d).ptr);
  LOCK();
  (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     (pQVar1 = (this->d).ptr, pQVar1 != (QStaticTextPrivate *)0x0)) {
    QStaticTextPrivate::~QStaticTextPrivate(pQVar1);
    operator_delete(pQVar1,0xe8);
  }
  (this->d).ptr = this_00;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}